

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O0

Vec3 vadd(Vec3 a,Vec3 b)

{
  Vec3 VVar1;
  undefined4 local_40;
  undefined4 uStack_3c;
  Vec3 b_local;
  undefined4 local_20;
  undefined4 uStack_1c;
  Vec3 a_local;
  
  local_20 = a.x;
  local_40 = b.x;
  uStack_1c = a.y;
  uStack_3c = b.y;
  VVar1.y = uStack_1c + uStack_3c;
  VVar1.x = local_20 + local_40;
  VVar1.z = a.z + b.z;
  return VVar1;
}

Assistant:

static inline Vec3 vadd(Vec3 a, Vec3 b) {
    return (Vec3) {
        a.x + b.x,
            a.y + b.y,
            a.z + b.z
            };
}